

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::
stringifyBinaryExpr<burst::k_ary_search_set<int,std::less<void>>,std::initializer_list<int>>
          (String *__return_storage_ptr__,detail *this,k_ary_search_set<int,_std::less<void>_> *lhs,
          char *op,initializer_list<int> *rhs)

{
  String local_70;
  String local_58;
  String local_40;
  String local_28;
  
  String::String(&local_40,"{?}");
  String::String(&local_58,(char *)lhs);
  doctest::operator+(&local_28,&local_40,&local_58);
  String::String(&local_70,"{?}");
  doctest::operator+(__return_storage_ptr__,&local_28,&local_70);
  String::~String(&local_70);
  String::~String(&local_28);
  String::~String(&local_58);
  String::~String(&local_40);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }